

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# collective.hpp
# Opt level: O1

void mxx::all2allv<std::pair<int,double>>
               (pair<int,_double> *msgs,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *send_sizes,
               pair<int,_double> *out,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *recv_sizes,comm *comm)

{
  pointer puVar1;
  uint uVar2;
  uint uVar3;
  pointer puVar4;
  vector<int,_std::allocator<int>_> recv_counts;
  size_t max;
  datatype dt_1;
  vector<int,_std::allocator<int>_> send_displs;
  vector<int,_std::allocator<int>_> send_counts;
  datatype mpi_sizet;
  vector<int,_std::allocator<int>_> recv_displs;
  size_t local_max_size;
  
  puVar4 = (send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar2 = 0;
  uVar3 = 0;
  if (puVar4 != puVar1) {
    uVar3 = 0;
    do {
      uVar3 = uVar3 + (int)*puVar4;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  puVar4 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_start;
  puVar1 = (recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  if (puVar4 != puVar1) {
    uVar2 = 0;
    do {
      uVar2 = uVar2 + (int)*puVar4;
      puVar4 = puVar4 + 1;
    } while (puVar4 != puVar1);
  }
  if (uVar2 < uVar3) {
    uVar2 = uVar3;
  }
  local_max_size = (size_t)(int)uVar2;
  mpi_sizet._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
  mpi_sizet.mpitype = (MPI_Datatype)&ompi_mpi_unsigned_long;
  mpi_sizet.builtin = true;
  MPI_Allreduce(&local_max_size,&max,1,&ompi_mpi_unsigned_long,&ompi_mpi_op_max,comm->mpi_comm);
  if (max < 0x7fffffff) {
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)&send_counts,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(send_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&recv_counts);
    std::vector<int,std::allocator<int>>::
    vector<__gnu_cxx::__normal_iterator<unsigned_long_const*,std::vector<unsigned_long,std::allocator<unsigned_long>>>,void>
              ((vector<int,std::allocator<int>> *)&recv_counts,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_start,
               (__normal_iterator<const_unsigned_long_*,_std::vector<unsigned_long,_std::allocator<unsigned_long>_>_>
                )(recv_sizes->super__Vector_base<unsigned_long,_std::allocator<unsigned_long>_>).
                 _M_impl.super__Vector_impl_data._M_finish,(allocator_type *)&send_displs);
    impl::get_displacements<int>(&send_displs,&send_counts);
    impl::get_displacements<int>(&recv_displs,&recv_counts);
    dt_1.mpitype = datatype_builder<std::pair<int,_double>_>::get_type();
    dt_1._vptr_datatype = (_func_int **)&PTR__datatype_001a5d60;
    dt_1.builtin = false;
    MPI_Alltoallv(msgs,send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start,
                  send_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,dt_1.mpitype,out,
                  recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,
                  recv_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_start,dt_1.mpitype,comm->mpi_comm);
    datatype::~datatype(&dt_1);
    if (recv_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(recv_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (send_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(send_displs.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(recv_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
    if (send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
        _M_start != (pointer)0x0) {
      operator_delete(send_counts.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_start);
    }
  }
  else {
    impl::all2allv_big<std::pair<int,double>>(msgs,send_sizes,out,recv_sizes,comm);
  }
  datatype::~datatype(&mpi_sizet);
  return;
}

Assistant:

void all2allv(const T* msgs, const std::vector<size_t>& send_sizes, T* out, const std::vector<size_t>& recv_sizes, const mxx::comm& comm = mxx::comm()) {
    size_t total_send_size = std::accumulate(send_sizes.begin(), send_sizes.end(), 0);
    size_t total_recv_size = std::accumulate(recv_sizes.begin(), recv_sizes.end(), 0);
    size_t local_max_size = std::max(total_send_size, total_recv_size);
    mxx::datatype mpi_sizet = mxx::get_datatype<size_t>();
    size_t max;
    MPI_Allreduce(&local_max_size, &max, 1, mpi_sizet.type(), MPI_MAX, comm);
    if (max >= mxx::max_int) {
        impl::all2allv_big(msgs, send_sizes, out, recv_sizes, comm);
    } else {
        // convert vectors to integer counts
        std::vector<int> send_counts(send_sizes.begin(), send_sizes.end());
        std::vector<int> recv_counts(recv_sizes.begin(), recv_sizes.end());
        // get displacements
        std::vector<int> send_displs = impl::get_displacements(send_counts);
        std::vector<int> recv_displs = impl::get_displacements(recv_counts);
        // call regular alltoallv
        mxx::datatype dt = mxx::get_datatype<T>();
        MPI_Alltoallv(const_cast<T*>(msgs), &send_counts[0], &send_displs[0], dt.type(),
                      out, &recv_counts[0], &recv_displs[0], dt.type(), comm);
    }
}